

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O0

int SetRudderPololu(POLOLU *pPololu,double angle)

{
  int iVar1;
  int local_8c;
  int local_88;
  int local_84;
  double local_80;
  double local_70;
  double local_60;
  double local_48;
  double local_40;
  double angletmp;
  int pw;
  double angle_local;
  POLOLU *pPololu_local;
  
  if (angle < 0.0) {
    if (ABS(pPololu->MinAngle) <= ABS(pPololu->MaxAngle)) {
      local_60 = pPololu->MaxAngle;
    }
    else {
      local_60 = pPololu->MinAngle;
    }
    local_60 = ABS(local_60);
    local_48 = pPololu->MidAngle + (angle * (pPololu->MidAngle - pPololu->MinAngle)) / local_60;
  }
  else {
    if (ABS(pPololu->MinAngle) <= ABS(pPololu->MaxAngle)) {
      local_40 = pPololu->MaxAngle;
    }
    else {
      local_40 = pPololu->MinAngle;
    }
    local_40 = ABS(local_40);
    local_48 = pPololu->MidAngle + (angle * (pPololu->MaxAngle - pPololu->MidAngle)) / local_40;
  }
  if (local_48 < 0.0) {
    if (ABS(pPololu->MinAngle) <= ABS(pPololu->MaxAngle)) {
      local_80 = pPololu->MaxAngle;
    }
    else {
      local_80 = pPololu->MinAngle;
    }
    local_80 = ABS(local_80);
    local_70 = (local_48 * 500.0) / local_80;
  }
  else {
    if (ABS(pPololu->MinAngle) <= ABS(pPololu->MaxAngle)) {
      local_70 = pPololu->MaxAngle;
    }
    else {
      local_70 = pPololu->MinAngle;
    }
    local_70 = ABS(local_70);
    local_70 = (local_48 * 500.0) / local_70;
  }
  angletmp._4_4_ = (int)local_70 + 0x5dc;
  if (angletmp._4_4_ < 2000) {
    local_84 = angletmp._4_4_;
  }
  else {
    local_84 = 2000;
  }
  if (local_84 < 0x3e9) {
    local_8c = 1000;
  }
  else {
    if (angletmp._4_4_ < 2000) {
      local_88 = angletmp._4_4_;
    }
    else {
      local_88 = 2000;
    }
    local_8c = local_88;
  }
  iVar1 = SetPWMPololu(pPololu,pPololu->rudderchan,local_8c);
  return iVar1;
}

Assistant:

inline int SetRudderPololu(POLOLU* pPololu, double angle)
{
	int pw = 0;
#ifndef DISABLE_RUDDER_MIDANGLE
	double angletmp = 0;
#endif // DISABLE_RUDDER_MIDANGLE

	// Convert angle (in rad) into Pololu pulse width (in us).
#ifndef DISABLE_RUDDER_MIDANGLE
	angletmp = angle >= 0? pPololu->MidAngle+angle*(pPololu->MaxAngle-pPololu->MidAngle)/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle)): pPololu->MidAngle+angle*(pPololu->MidAngle-pPololu->MinAngle)/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle));
	//angletmp = angle >= 0? pPololu->MidAngle+urudder*(pPololu->MaxAngle-pPololu->MidAngle): pPololu->MidAngle+urudder*(pPololu->MidAngle-pPololu->MinAngle);
	if (angletmp >= 0)
		pw = DEFAULT_MID_PW_POLOLU+(int)(angletmp*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MID_PW_POLOLU)
			/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle)));
	else
		pw = DEFAULT_MID_PW_POLOLU+(int)(angletmp*(DEFAULT_MID_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)
			/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle)));
#else
	pw = DEFAULT_MID_PW_POLOLU+(int)(angle*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)
		/(pPololu->MaxAngle-pPololu->MinAngle));
#endif // !DISABLE_POLOLU_MIDANGLE

	pw = max(min(pw, DEFAULT_MAX_PW_POLOLU), DEFAULT_MIN_PW_POLOLU);

	return SetPWMPololu(pPololu, pPololu->rudderchan, pw);
}